

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_value_scalar_Test::TestBody(sim_value_scalar_Test *this)

{
  __node_base _Var1;
  bool bVar2;
  int iVar3;
  Generator *this_00;
  Var *pVVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  unsigned_long *lhs;
  char *in_R9;
  optional<unsigned_long> oVar6;
  AssertHelper local_4a0;
  Message local_498;
  int local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar;
  AssertHelper local_458;
  Message local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_;
  optional<unsigned_long> res;
  undefined1 local_418 [12];
  undefined1 local_408 [8];
  Simulator sim;
  shared_ptr<kratos::Stmt> local_250;
  undefined1 local_240 [32];
  undefined1 local_220 [39];
  allocator<char> local_1f9;
  string local_1f8;
  Var *local_1d8;
  Var *c;
  string local_1c8;
  Var *local_1a8;
  Var *b;
  string local_198;
  __node_base local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  __node_base local_138;
  Generator *mod;
  Context context;
  sim_value_scalar_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  this_00 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138._M_nxt = (_Hash_node_base *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"a",(allocator<char> *)((long)&b + 7));
  pVVar4 = kratos::Generator::var(this_00,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&b + 7));
  _Var1._M_nxt = local_138._M_nxt;
  local_178._M_nxt = (_Hash_node_base *)pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"b",(allocator<char> *)((long)&c + 7));
  pVVar4 = kratos::Generator::var((Generator *)_Var1._M_nxt,&local_1c8,1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&c + 7));
  _Var1._M_nxt = local_138._M_nxt;
  local_1a8 = pVVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"c",&local_1f9);
  pVVar4 = kratos::Generator::var((Generator *)_Var1._M_nxt,&local_1f8,3);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  _Var1._M_nxt = local_138._M_nxt;
  local_1d8 = pVVar4;
  iVar3 = (*(pVVar4->super_IRNode)._vptr_IRNode[9])(pVVar4,0);
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)local_220,(Var *)CONCAT44(extraout_var,iVar3));
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_220 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_220);
  kratos::Generator::add_stmt
            ((Generator *)_Var1._M_nxt,(shared_ptr<kratos::Stmt> *)(local_220 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_220 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_220);
  _Var1._M_nxt = local_138._M_nxt;
  iVar3 = (*(local_1d8->super_IRNode)._vptr_IRNode[9])(local_1d8,1);
  kratos::Var::assign((Var *)local_240,(Var *)CONCAT44(extraout_var_00,iVar3));
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_240 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_240);
  kratos::Generator::add_stmt
            ((Generator *)_Var1._M_nxt,(shared_ptr<kratos::Stmt> *)(local_240 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_240 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_240);
  _Var1._M_nxt = local_138._M_nxt;
  kratos::Var::assign((Var *)&sim.simulation_depth_,(Var *)local_178._M_nxt);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            (&local_250,(shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Generator::add_stmt((Generator *)_Var1._M_nxt,&local_250);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_250);
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr
            ((shared_ptr<kratos::AssignStmt> *)&sim.simulation_depth_);
  kratos::Simulator::Simulator((Simulator *)local_408,(Generator *)local_138._M_nxt);
  pVVar4 = local_1a8;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 1;
  std::optional<unsigned_long>::optional<int,_true>
            ((optional<unsigned_long> *)local_418,
             (int *)&res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>.field_0xc);
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._12_4_ = 0;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)local_418._0_8_;
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_418[8];
  oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_3_ = local_418._9_3_;
  kratos::Simulator::set((Simulator *)local_408,pVVar4,oVar6,true);
  oVar6 = kratos::Simulator::get((Simulator *)local_408,local_1d8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  res.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_441 = std::operator!=(&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar2) {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_440,
               (AssertionResult *)"res != std::nullopt","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x25,pcVar5);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  lhs = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&gtest_ar_.message_);
  local_48c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_488,"*res","2",lhs,&local_48c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x26,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  kratos::Simulator::~Simulator((Simulator *)local_408);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, value_scalar) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 1);
    auto &b = mod.var("b", 1);
    auto &c = mod.var("c", 3);
    mod.add_stmt(c[0].assign(constant(0, 1)));
    mod.add_stmt(c[1].assign(b));
    mod.add_stmt(a.assign(b));

    Simulator sim(&mod);
    sim.set(&b, 1);

    auto res = sim.get(&c);
    EXPECT_TRUE(res != std::nullopt);
    EXPECT_EQ(*res, 2);
}